

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int pigpio_command(int fd,int command,int p1,int p2,int rl)

{
  ssize_t sVar1;
  int in_EDI;
  int in_R8D;
  cmdCmd_t cmd;
  undefined1 local_28 [12];
  int local_1c;
  int local_18;
  int local_8;
  int local_4;
  
  local_1c = 0;
  local_18 = in_R8D;
  local_8 = in_EDI;
  pthread_mutex_lock((pthread_mutex_t *)&command_mutex);
  sVar1 = send(local_8,local_28,0x10,0);
  if (sVar1 == 0x10) {
    sVar1 = recv(local_8,local_28,0x10,0x100);
    if (sVar1 == 0x10) {
      if (local_18 != 0) {
        pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
      }
      local_4 = local_1c;
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
      local_4 = -0x7d1;
    }
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
    local_4 = -2000;
  }
  return local_4;
}

Assistant:

static int pigpio_command(int fd, int command, int p1, int p2, int rl)
{
   cmdCmd_t cmd;

   cmd.cmd = command;
   cmd.p1  = p1;
   cmd.p2  = p2;
   cmd.res = 0;

   pthread_mutex_lock(&command_mutex);

   if (send(fd, &cmd, sizeof(cmd), 0) != sizeof(cmd))
   {
      pthread_mutex_unlock(&command_mutex);
      return pigif_bad_send;
   }

   if (recv(fd, &cmd, sizeof(cmd), MSG_WAITALL) != sizeof(cmd))
   {
      pthread_mutex_unlock(&command_mutex);
      return pigif_bad_recv;
   }

   if (rl) pthread_mutex_unlock(&command_mutex);

   return cmd.res;
}